

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O3

void __thiscall
soplex::
DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setMax(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int newmax)

{
  undefined4 *puVar1;
  uint uVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  uint uVar4;
  long lVar5;
  int *piVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  long lVar9;
  byte bVar10;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *newmem;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_20;
  
  bVar10 = 0;
  uVar2 = (this->
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).memused;
  if (newmax < (int)uVar2) {
    newmax = uVar2;
  }
  if (newmax != (this->
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).memsize) {
    local_20 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
    spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (&local_20,newmax);
    if ((int)uVar2 < 1) {
      uVar4 = 0;
    }
    else {
      lVar9 = 0;
      do {
        puVar1 = (undefined4 *)((long)(&local_20->val + 1) + lVar9);
        pNVar3 = this->theelem;
        puVar7 = (undefined4 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar9);
        puVar8 = puVar1 + -0x20;
        for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar8 = *puVar7;
          puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
          puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
        }
        puVar1[-4] = *(undefined4 *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar9);
        *(undefined1 *)(puVar1 + -3) =
             *(undefined1 *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar9 + 4);
        *(undefined8 *)(puVar1 + -2) =
             *(undefined8 *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar9 + 8);
        *puVar1 = *(undefined4 *)((long)(&pNVar3->val + 1) + lVar9);
        lVar9 = lVar9 + 0x84;
        uVar4 = uVar2;
      } while ((ulong)uVar2 * 0x84 != lVar9);
    }
    if ((int)uVar4 < newmax) {
      piVar6 = &local_20[uVar4].idx;
      lVar9 = (ulong)(uint)newmax - (ulong)uVar4;
      do {
        *(undefined8 *)(piVar6 + -2) = 0x1c00000000;
        (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(piVar6 + -0x20))->val).m_backend.data._M_elems[0] = 0;
        (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(piVar6 + -0x20))->val).m_backend.data._M_elems[1] = 0;
        (piVar6 + -0x1e)[0] = 0;
        (piVar6 + -0x1e)[1] = 0;
        (piVar6 + -0x1c)[0] = 0;
        (piVar6 + -0x1c)[1] = 0;
        (piVar6 + -0x1a)[0] = 0;
        (piVar6 + -0x1a)[1] = 0;
        (piVar6 + -0x18)[0] = 0;
        (piVar6 + -0x18)[1] = 0;
        (piVar6 + -0x16)[0] = 0;
        (piVar6 + -0x16)[1] = 0;
        (piVar6 + -0x14)[0] = 0;
        (piVar6 + -0x14)[1] = 0;
        (piVar6 + -0x12)[0] = 0;
        (piVar6 + -0x12)[1] = 0;
        (piVar6 + -0x10)[0] = 0;
        (piVar6 + -0x10)[1] = 0;
        (piVar6 + -0xe)[0] = 0;
        (piVar6 + -0xe)[1] = 0;
        (piVar6 + -0xc)[0] = 0;
        (piVar6 + -0xc)[1] = 0;
        (piVar6 + -10)[0] = 0;
        (piVar6 + -10)[1] = 0;
        (piVar6 + -8)[0] = 0;
        (piVar6 + -8)[1] = 0;
        (piVar6 + -6)[0] = 0;
        (piVar6 + -6)[1] = 0;
        *(undefined8 *)((long)piVar6 + -0x13) = 0;
        *piVar6 = 0;
        piVar6 = piVar6 + 0x21;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    if (this->theelem !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(this->theelem);
    }
    this->theelem = local_20;
    (this->
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).m_elem = local_20;
    (this->
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).memsize = newmax;
    (this->
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).memused = uVar2;
  }
  return;
}

Assistant:

void setMax(int newmax = 1)
   {
      int siz = SVectorBase<R>::size();
      int len = (newmax < siz) ? siz : newmax;

      if(len == SVectorBase<R>::max())
         return;

      Nonzero<R>* newmem = nullptr;

      /* allocate new memory */
      spx_alloc(newmem, len);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < siz; i++)
         new((&newmem[i])) Nonzero<R>(theelem[i]);

      /* call default constructor for remaining elements */
      for(; i < len; i++)
         new((&newmem[i])) Nonzero<R>();

      /* free old memory */
      for(i = SVectorBase<R>::max() - 1; i >= 0; i--)
         theelem[i].~Nonzero<R>();

      if(theelem != nullptr)
         spx_free(theelem);

      /* assign new memory */
      theelem = newmem;
      SVectorBase<R>::setMem(len, theelem);
      SVectorBase<R>::set_size(siz);
   }